

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::MarkImplicitRoots
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  BVIndex BVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  Recycler *pRVar9;
  uint i_2;
  HeapBlockMap *map;
  uint local_38;
  int index;
  uint i_1;
  uint i;
  ushort markCountPerPage [1];
  SmallHeapBlockBitVector *pSStack_28;
  uint localObjectSize;
  SmallHeapBlockBitVector *mark;
  uint localMarkCount;
  uint localObjectBitDelta;
  uint localObjectCount;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  uVar4 = GetObjectCount(this);
  uVar3 = GetObjectBitDelta(this);
  mark._4_4_ = 0;
  pSStack_28 = GetMarkedBitVector(this);
  i = GetObjectSize(this);
  if (0x2000 < i) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x78e,"(localObjectSize <= HeapConstants::MaxMediumObjectSize)",
                       "localObjectSize <= HeapConstants::MaxMediumObjectSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = false;
  while (!bVar2) {
    i_1._2_2_ = 0;
    bVar2 = true;
  }
  local_38 = 0;
  do {
    if (uVar4 <= local_38) {
      BVar6 = BVStatic<256UL>::Count(pSStack_28);
      if (BVar6 != mark._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x7a9,"(mark->Count() == localMarkCount)",
                           "mark->Count() == localMarkCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this->markCount = (ushort)mark._4_4_;
      pRVar9 = GetRecycler(this);
      bVar2 = false;
      while (!bVar2) {
        HeapBlockMap64::SetPageMarkCount
                  (&pRVar9->heapBlockMap,(this->super_HeapBlock).address,i_1._2_2_);
        bVar2 = true;
      }
      return;
    }
    pbVar8 = ObjectInfo(this,local_38);
    if ((*pbVar8 & 8) != 0) {
      uVar5 = local_38 * i >> 0xc;
      if (uVar5 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x7a0,"(index < TBlockAttributes::PageCount)",
                           "index < TBlockAttributes::PageCount");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *(short *)((long)&i_1 + (long)(int)uVar5 * 2 + 2) =
           *(short *)((long)&i_1 + (long)(int)uVar5 * 2 + 2) + 1;
      BVStatic<256UL>::Set(pSStack_28,uVar3 * local_38);
      mark._4_4_ = mark._4_4_ + 1;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::MarkImplicitRoots()
{
    uint localObjectCount = this->GetObjectCount();
    uint localObjectBitDelta = this->GetObjectBitDelta();
    uint localMarkCount = 0;
    SmallHeapBlockBitVector * mark = this->GetMarkedBitVector();

#if DBG
    uint localObjectSize = this->GetObjectSize();
    Assert(localObjectSize <= HeapConstants::MaxMediumObjectSize);

    ushort markCountPerPage[TBlockAttributes::PageCount];
    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        markCountPerPage[i] = 0;
    }
#endif

    for (uint i = 0; i < localObjectCount; i++)
    {
        // REVIEW: This may include free object.  It is okay to mark them and scan them
        // But kind inefficient.
        if (this->ObjectInfo(i) & ImplicitRootBit)
        {
#if DBG
            {
                int index = (i * localObjectSize) / AutoSystemInfo::PageSize;
                Assert(index < TBlockAttributes::PageCount);
                markCountPerPage[index]++;
            }
#endif

            mark->Set(localObjectBitDelta * i);
            localMarkCount++;
        }
    }
    Assert(mark->Count() == localMarkCount);
    this->markCount = (ushort)localMarkCount;
#if DBG
    HeapBlockMap& map = this->GetRecycler()->heapBlockMap;

    for (uint i = 0; i < TBlockAttributes::PageCount; i++)
    {
        map.SetPageMarkCount(this->address + (i * AutoSystemInfo::PageSize), markCountPerPage[i]);
    }
#endif
}